

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

uint32_t immutable::rrb_details::find_shift<char,false,5>
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *node)

{
  uint32_t uVar1;
  tree_node<char,_false> *ptVar2;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_28;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  internal_node<char,_false> *inode;
  ref<immutable::rrb_details::tree_node<char,_false>_> *node_local;
  
  ptVar2 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(node);
  if (ptVar2->type == LEAF_NODE) {
    node_local._4_4_ = 0;
  }
  else {
    child = (ref<immutable::rrb_details::tree_node<char,_false>_>)node->ptr;
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_28,
               *(ref<immutable::rrb_details::internal_node<char,_false>_> **)
                &child.ptr[1]._ref_count);
    uVar1 = find_shift<char,false,5>(&local_28);
    node_local._4_4_ = uVar1 + 5;
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_28);
  }
  return node_local._4_4_;
}

Assistant:

uint32_t find_shift(const ref<tree_node<T, atomic_ref_counting>>& node)
      {
      if (node->type == LEAF_NODE)
        {
        return 0;
        }
      else
        { // must be internal node
        internal_node<T, atomic_ref_counting>* inode = (internal_node<T, atomic_ref_counting>*)node.ptr;
        ref<tree_node<T, atomic_ref_counting>> child = inode->child[0];
        return bits<N>::rrb_bits + find_shift<T, atomic_ref_counting, N>(child);
        }
      }